

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zarray.c
# Opt level: O0

int zstrcmp(void *a_pp,void *b_pp)

{
  int iVar1;
  char *b;
  char *a;
  void *b_pp_local;
  void *a_pp_local;
  
  if (a_pp == (void *)0x0) {
    __assert_fail("a_pp != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.c"
                  ,0x25,"int zstrcmp(const void *, const void *)");
  }
  if (b_pp != (void *)0x0) {
    iVar1 = strcmp(*a_pp,*b_pp);
    return iVar1;
  }
  __assert_fail("b_pp != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.c"
                ,0x26,"int zstrcmp(const void *, const void *)");
}

Assistant:

int zstrcmp(const void * a_pp, const void * b_pp)
{
    assert(a_pp != NULL);
    assert(b_pp != NULL);

    char * a = *(void**)a_pp;
    char * b = *(void**)b_pp;

    return strcmp(a,b);
}